

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int ffbinre(char **ptr,char *colname,char **exprbeg,char **exprend,double *minin,double *maxin,
           double *binsizein,char *minname,char *maxname,char *binname,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  char *pcVar5;
  double dVar6;
  char *token;
  int isanumber;
  char *local_38;
  
  isanumber = 0;
  token = (char *)0x0;
  if (0 < *status) {
    return *status;
  }
  iVar1 = fits_get_token2(ptr," ,=:;(",&token,&isanumber,status);
  if (*status != 0) {
    return *status;
  }
  pbVar4 = (byte *)*ptr;
  if (((iVar1 == 0) && ((ulong)*pbVar4 < 0x3c)) &&
     ((0x800100000000001U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0)) {
    return 0;
  }
  if (isanumber == 0) {
    if (*pbVar4 != 0x3a) {
      if (token != (char *)0x0) {
        local_38 = token;
        sVar2 = strlen(token);
        if (0x46 < sVar2) {
          pcVar5 = "column name too long (ffbinr)";
          goto LAB_0016f7b3;
        }
        pcVar5 = local_38;
        if ((*local_38 == '#') &&
           (ppuVar3 = __ctype_b_loc(), pcVar5 = local_38,
           (*(byte *)((long)*ppuVar3 + (long)local_38[1] * 2 + 1) & 8) != 0)) {
          pcVar5 = local_38 + 1;
        }
        strcpy(colname,pcVar5);
        free(local_38);
        token = (char *)0x0;
        pbVar4 = (byte *)*ptr;
      }
      while (*pbVar4 == 0x20) {
        pbVar4 = pbVar4 + 1;
        *ptr = (char *)pbVar4;
      }
      if (exprend == (char **)0x0) goto LAB_0016f865;
      if (exprbeg == (char **)0x0) goto LAB_0016f865;
      if (*pbVar4 != 0x28) goto LAB_0016f865;
      *exprbeg = (char *)pbVar4;
      pbVar4 = (byte *)fits_find_match_delim(*ptr + 1,')');
      *exprend = (char *)pbVar4;
      if (pbVar4 == (byte *)0x0) {
        ffpmsg("bin expression syntax error (ffbinr)");
        *status = 0x1af;
        return 0x1af;
      }
      while( true ) {
        *ptr = (char *)pbVar4;
LAB_0016f865:
        if (*pbVar4 != 0x20) break;
        pbVar4 = pbVar4 + 1;
      }
      if (*pbVar4 != 0x3d) {
        return *status;
      }
      do {
        pbVar4 = pbVar4 + 1;
        *ptr = (char *)pbVar4;
      } while (*pbVar4 == 0x20);
      iVar1 = fits_get_token2(ptr," ,:;",&token,&isanumber,status);
      if (*status != 0) {
        return *status;
      }
      pbVar4 = (byte *)*ptr;
      goto LAB_0016f560;
    }
LAB_0016f5b7:
    pcVar5 = token;
    if (iVar1 != 0) {
      if (isanumber == 0) {
        sVar2 = strlen(token);
        if (0x46 < sVar2) {
          pcVar5 = "minname too long (ffbinr)";
          goto LAB_0016f7b3;
        }
        strcpy(minname,pcVar5);
      }
      else {
        dVar6 = strtod(token,(char **)0x0);
        *minin = dVar6;
        pcVar5 = token;
      }
      free(pcVar5);
      token = (char *)0x0;
      pbVar4 = (byte *)*ptr;
    }
    *ptr = (char *)(pbVar4 + 1);
    iVar1 = fits_get_token2(ptr," ,:;",&token,&isanumber,status);
    pcVar5 = token;
    if (*status != 0) {
      return *status;
    }
    if (iVar1 != 0) {
      if (isanumber == 0) {
        sVar2 = strlen(token);
        if (0x46 < sVar2) {
          pcVar5 = "maxname too long (ffbinr)";
          goto LAB_0016f7b3;
        }
        strcpy(maxname,pcVar5);
      }
      else {
        dVar6 = strtod(token,(char **)0x0);
        *maxin = dVar6;
        pcVar5 = token;
      }
      free(pcVar5);
      token = (char *)0x0;
    }
    if (**ptr != ':') {
      free(token);
      return *status;
    }
    *ptr = *ptr + 1;
    iVar1 = fits_get_token2(ptr," ,:;",&token,&isanumber,status);
    if (*status != 0) {
      return *status;
    }
    pcVar5 = token;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0016f560:
    if (*pbVar4 == 0x3a) goto LAB_0016f5b7;
    pcVar5 = token;
    if (token == (char *)0x0) {
      return 0;
    }
  }
  token = pcVar5;
  if (isanumber == 0) {
    sVar2 = strlen(pcVar5);
    if (0x46 < sVar2) {
      pcVar5 = "binname too long (ffbinr)";
LAB_0016f7b3:
      ffpmsg(pcVar5);
      free(token);
      *status = 0x1af;
      return 0x1af;
    }
    strcpy(binname,pcVar5);
  }
  else {
    dVar6 = strtod(pcVar5,(char **)0x0);
    *binsizein = dVar6;
    pcVar5 = token;
  }
  free(pcVar5);
  return *status;
}

Assistant:

int ffbinre(char **ptr, 
	    char *colname, 
	    char **exprbeg, char **exprend,
	    double *minin,
	    double *maxin, 
	    double *binsizein,
	    char *minname,
	    char *maxname,
	    char *binname,
	    int *status)
/*
   Parse the input binning range specification string, returning 
   the column name, histogram min and max values, and bin size.

   This is the "extended" binning syntax that allows for an expression
   of the form XCOL(expr).  The expression must be enclosed in parentheses.

   The start and end of the expression are returned in *exprbeg and *exprend.
   If exprbeg and exprend are null pointers then the expression is forbidden.
*/
{
    int slen, isanumber=0;
    char *token=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,=:;(", &token, &isanumber, status); /* get 1st token */

    if ((*status) || (slen == 0 && (**ptr == '\0' || **ptr == ',' || **ptr == ';')) )
        return(*status);   /* a null range string */
        
    if (!isanumber && **ptr != ':')
    {
        /* this looks like the column name */
        
        /* Check for case where col name string is empty but '='
           is still there (indicating a following specification string).
           Musn't enter this block as token would not have been allocated. */
        if (token)
        {
           if (strlen(token) > FLEN_VALUE-1)
           {
              ffpmsg("column name too long (ffbinr)");
              free(token);
              return(*status=PARSE_SYNTAX_ERR);
           }
           if (token[0] == '#' && isdigit((int) token[1]) )
           {
               /* omit the leading '#' in the column number */
               strcpy(colname, token+1);
           }
           else
               strcpy(colname, token);
           free(token);
           token=0;
        }
        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

	/* An optional expression of the form XCOL(expr) is allowed here, but only 
	   if exprbeg and exprend are non-null */
	if (**ptr == '(' && exprbeg && exprend) {
	  *exprbeg = *ptr;
	  if ((*exprend = fits_find_match_delim(*ptr+1,')')) == 0) { /* find ')' */
              ffpmsg("bin expression syntax error (ffbinr)");
              return(*status=PARSE_SYNTAX_ERR);
	  }
	  *ptr = *exprend; /* Advance pointer past delimeter */
	}
        while (**ptr == ' ')  (*ptr)++; /* skip over more possible blanks */
	
        if (**ptr != '=')
            return(*status);  /* reached the end */
            
        (*ptr)++;   /* skip over the = sign */

        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

        /* get specification info */
        slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status);
        if (*status)
           return(*status);
    }

    if (**ptr != ':')
    {
        /* This is the first token, and since it is not followed by 
         a ':' this must be the binsize token. Or it could be empty. */
        if (token)
        {
           if (!isanumber)
           {
               if (strlen(token) > FLEN_VALUE-1)
               {
                  ffpmsg("binname too long (ffbinr)");
                  free(token);
                  return(*status=PARSE_SYNTAX_ERR);
               }
               strcpy(binname, token);
           }
           else
               *binsizein =  strtod(token, NULL);

           free(token);
        }
           
        return(*status);  /* reached the end */
    }
    else
    {
        /* the token contains the min value */
        if (slen)
        {
            if (!isanumber)
            {
                if (strlen(token) > FLEN_VALUE-1)
                {
                   ffpmsg("minname too long (ffbinr)");
                   free(token);
                   return(*status=PARSE_SYNTAX_ERR);
                }
                strcpy(minname, token);
            }
            else
                *minin = strtod(token, NULL);
            free(token);
            token=0;
        }
    }

    (*ptr)++;  /* skip the colon between the min and max values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the max value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("maxname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(maxname, token);
        }
        else
            *maxin = strtod(token, NULL);
        free(token);
        token=0;
    }

    if (**ptr != ':')
    {
        free(token);
        return(*status);  /* reached the end; no binsize token */
    }

    (*ptr)++;  /* skip the colon between the max and binsize values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the binsize value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("binname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(binname, token);
        }
        else
            *binsizein = strtod(token, NULL);
        free(token);
    }

    return(*status);
}